

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O3

bool __thiscall
Am_Inter_Location_Data::operator==(Am_Inter_Location_Data *this,Am_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  bool bVar2;
  int iVar3;
  
  AVar1 = id;
  iVar3 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(test_value);
  if (AVar1 == (Am_ID_Tag)iVar3) {
    if ((Am_Inter_Location_Data *)test_value != this) {
      bVar2 = operator==((Am_Inter_Location_Data *)test_value,this);
      return bVar2;
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

void
Am_Inter_Location_Data::Print(std::ostream &os) const
{
  os << "(";
  if (as_line) {
    os << data.line.x1 << "," << data.line.y1 << ").(" << data.line.x2 << ","
       << data.line.y2 << ")";
  } else if (growing)
    os << data.rect.left << "," << data.rect.top << "," << data.rect.width
       << "," << data.rect.height << ")";
  else
    os << data.rect.left << "," << data.rect.top << ")";
  os << " w.r.t. " << ref_obj;
}